

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O2

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *loop;
  watcher_list *pwVar4;
  long *plVar5;
  int iVar6;
  watcher_list *pwVar7;
  size_t sVar8;
  void **ppvVar9;
  int *piVar10;
  watcher_list *pwVar11;
  void **ppvVar12;
  watcher_list *pwVar13;
  bool bVar14;
  watcher_list *pwVar15;
  watcher_list *pwVar16;
  
  if ((handle->flags & 4) != 0) {
    return -0x16;
  }
  loop = handle->loop;
  if (loop->inotify_fd == -1) {
    iVar6 = inotify_init1(0x80800);
    if (iVar6 < 0) {
      piVar10 = __errno_location();
      if (*piVar10 != 0) {
        return -*piVar10;
      }
    }
    else {
      loop->inotify_fd = iVar6;
      uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar6);
      uv__io_start(loop,&loop->inotify_read_watcher,1);
    }
  }
  iVar6 = inotify_add_watch(handle->loop->inotify_fd,path,0xfc6);
  if (iVar6 == -1) {
    piVar10 = __errno_location();
    return -*piVar10;
  }
  pwVar7 = find_watcher(handle->loop,iVar6);
  if (pwVar7 == (watcher_list *)0x0) {
    sVar8 = strlen(path);
    pwVar7 = (watcher_list *)uv__malloc(sVar8 + 0x49);
    if (pwVar7 == (watcher_list *)0x0) {
      return -0xc;
    }
    pwVar7->wd = iVar6;
    memcpy(pwVar7 + 1,path,sVar8 + 1);
    pwVar7->path = (char *)(pwVar7 + 1);
    pwVar7->watchers[0] = pwVar7->watchers;
    pwVar7->watchers[1] = pwVar7->watchers;
    pwVar7->iterating = 0;
    ppvVar9 = &handle->loop->inotify_watchers;
    bVar14 = false;
    pwVar11 = (watcher_list *)0x0;
    pwVar15 = (watcher_list *)ppvVar9;
    while (pwVar15 = (pwVar15->entry).rbe_left, pwVar15 != (watcher_list *)0x0) {
      iVar2 = pwVar15->wd;
      bVar14 = iVar6 < iVar2;
      pwVar11 = pwVar15;
      if (iVar2 <= iVar6) {
        if (iVar6 <= iVar2) goto LAB_0011ab26;
        pwVar15 = (watcher_list *)&(pwVar15->entry).rbe_right;
      }
    }
    (pwVar7->entry).rbe_parent = pwVar11;
    (pwVar7->entry).rbe_left = (watcher_list *)0x0;
    (pwVar7->entry).rbe_right = (watcher_list *)0x0;
    (pwVar7->entry).rbe_color = 1;
    ppvVar12 = pwVar11->watchers + ((ulong)((byte)~bVar14 & 1) - 4);
    if (pwVar11 == (watcher_list *)0x0) {
      ppvVar12 = ppvVar9;
    }
    *ppvVar12 = pwVar7;
    pwVar15 = pwVar7;
    while ((pwVar11 = (pwVar15->entry).rbe_parent, pwVar11 != (watcher_list *)0x0 &&
           ((pwVar11->entry).rbe_color == 1))) {
      pwVar4 = (pwVar11->entry).rbe_parent;
      pwVar16 = (pwVar4->entry).rbe_left;
      pwVar13 = pwVar15;
      if (pwVar11 == pwVar16) {
        pwVar16 = (pwVar4->entry).rbe_right;
        if ((pwVar16 != (watcher_list *)0x0) && ((pwVar16->entry).rbe_color == 1))
        goto LAB_0011a9d8;
        pwVar16 = (pwVar11->entry).rbe_right;
        if (pwVar16 == pwVar15) {
          pwVar13 = (pwVar16->entry).rbe_left;
          (pwVar11->entry).rbe_right = pwVar13;
          if (pwVar13 == (watcher_list *)0x0) {
            (pwVar16->entry).rbe_parent = pwVar4;
            pwVar13 = (pwVar11->entry).rbe_parent;
LAB_0011aab5:
            ppvVar12 = pwVar13->watchers + ((ulong)(pwVar11 != (pwVar13->entry).rbe_left) - 4);
          }
          else {
            (pwVar13->entry).rbe_parent = pwVar11;
            pwVar13 = (pwVar11->entry).rbe_parent;
            (pwVar16->entry).rbe_parent = pwVar13;
            ppvVar12 = ppvVar9;
            if (pwVar13 != (watcher_list *)0x0) goto LAB_0011aab5;
          }
          *ppvVar12 = pwVar16;
          (pwVar16->entry).rbe_left = pwVar11;
          (pwVar11->entry).rbe_parent = pwVar16;
          pwVar13 = pwVar11;
          pwVar11 = pwVar15;
        }
        (pwVar11->entry).rbe_color = 0;
        (pwVar4->entry).rbe_color = 1;
        pwVar15 = (pwVar4->entry).rbe_left;
        pwVar11 = (pwVar15->entry).rbe_right;
        (pwVar4->entry).rbe_left = pwVar11;
        if (pwVar11 != (watcher_list *)0x0) {
          (pwVar11->entry).rbe_parent = pwVar4;
        }
        pwVar11 = (pwVar4->entry).rbe_parent;
        (pwVar15->entry).rbe_parent = pwVar11;
        ppvVar12 = ppvVar9;
        if (pwVar11 != (watcher_list *)0x0) {
          ppvVar12 = pwVar11->watchers + ((ulong)(pwVar4 != (pwVar11->entry).rbe_left) - 4);
        }
        *ppvVar12 = pwVar15;
        (pwVar15->entry).rbe_right = pwVar4;
LAB_0011ab13:
        (pwVar4->entry).rbe_parent = pwVar15;
        pwVar15 = pwVar13;
      }
      else {
        if ((pwVar16 == (watcher_list *)0x0) || ((pwVar16->entry).rbe_color != 1)) {
          pwVar16 = (pwVar11->entry).rbe_left;
          if (pwVar16 == pwVar15) {
            pwVar13 = (pwVar16->entry).rbe_right;
            (pwVar11->entry).rbe_left = pwVar13;
            if (pwVar13 == (watcher_list *)0x0) {
              (pwVar16->entry).rbe_parent = pwVar4;
              pwVar13 = (pwVar11->entry).rbe_parent;
LAB_0011aa4c:
              ppvVar12 = pwVar13->watchers + ((ulong)(pwVar11 != (pwVar13->entry).rbe_left) - 4);
            }
            else {
              (pwVar13->entry).rbe_parent = pwVar11;
              pwVar13 = (pwVar11->entry).rbe_parent;
              (pwVar16->entry).rbe_parent = pwVar13;
              ppvVar12 = ppvVar9;
              if (pwVar13 != (watcher_list *)0x0) goto LAB_0011aa4c;
            }
            *ppvVar12 = pwVar16;
            (pwVar16->entry).rbe_right = pwVar11;
            (pwVar11->entry).rbe_parent = pwVar16;
            pwVar13 = pwVar11;
            pwVar11 = pwVar15;
          }
          (pwVar11->entry).rbe_color = 0;
          (pwVar4->entry).rbe_color = 1;
          pwVar15 = (pwVar4->entry).rbe_right;
          pwVar11 = (pwVar15->entry).rbe_left;
          (pwVar4->entry).rbe_right = pwVar11;
          if (pwVar11 != (watcher_list *)0x0) {
            (pwVar11->entry).rbe_parent = pwVar4;
          }
          pwVar11 = (pwVar4->entry).rbe_parent;
          (pwVar15->entry).rbe_parent = pwVar11;
          ppvVar12 = ppvVar9;
          if (pwVar11 != (watcher_list *)0x0) {
            ppvVar12 = pwVar11->watchers + ((ulong)(pwVar4 != (pwVar11->entry).rbe_left) - 4);
          }
          *ppvVar12 = pwVar15;
          (pwVar15->entry).rbe_left = pwVar4;
          goto LAB_0011ab13;
        }
LAB_0011a9d8:
        (pwVar16->entry).rbe_color = 0;
        (pwVar11->entry).rbe_color = 0;
        (pwVar4->entry).rbe_color = 1;
        pwVar15 = pwVar4;
      }
    }
    *(undefined4 *)((long)*ppvVar9 + 0x18) = 0;
  }
LAB_0011ab26:
  uVar3 = handle->flags;
  if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 + 1;
  }
  handle->watchers[0] = pwVar7->watchers;
  plVar5 = (long *)pwVar7->watchers[1];
  handle->watchers[1] = plVar5;
  *plVar5 = (long)handle->watchers;
  pwVar7->watchers[1] = handle->watchers;
  handle->path = pwVar7->path;
  handle->cb = cb;
  handle->wd = iVar6;
  return 0;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}